

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::RandomOrderTexImageCubeCase::createTexture
          (RandomOrderTexImageCubeCase *this)

{
  ContextWrapper *this_00;
  float fVar1;
  float fVar2;
  CubeFace CVar3;
  deUint32 internalFormat;
  deUint32 format;
  deUint32 type;
  deUint32 dVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int ndx;
  long lVar10;
  float fVar11;
  deUint32 tex;
  int local_e4;
  vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_> images;
  Vec4 gMax;
  Vec4 gMin;
  Random rnd;
  TextureLevel levelData;
  PixelBufferAccess local_58;
  
  tex = 0;
  local_58.super_ConstPixelBufferAccess.m_format =
       glu::mapGLTransferFormat(this->m_format,this->m_dataType);
  tcu::TextureLevel::TextureLevel(&levelData,(TextureFormat *)&local_58);
  dVar4 = deStringHash((this->super_TextureCubeSpecCase).super_TextureSpecCase.super_TestCase.
                       super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar4);
  this_00 = &(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0x8513,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
  std::vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>::
  vector(&images,(long)((this->super_TextureCubeSpecCase).m_numLevels * 6),
         (allocator_type *)&local_58);
  iVar6 = (this->super_TextureCubeSpecCase).m_numLevels;
  if (0 < iVar6) {
    iVar5 = 0;
    iVar7 = 0;
    do {
      lVar8 = 0;
      do {
        iVar9 = iVar5 + (CubeFace)lVar8;
        images.
        super__Vector_base<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
        ._M_impl.super__Vector_impl_data._M_start[iVar9].first = iVar7;
        images.
        super__Vector_base<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
        ._M_impl.super__Vector_impl_data._M_start[iVar9].second = (CubeFace)lVar8;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 6);
      iVar7 = iVar7 + 1;
      iVar5 = iVar5 + 6;
    } while (iVar7 != iVar6);
  }
  de::Random::
  shuffle<__gnu_cxx::__normal_iterator<std::pair<int,tcu::CubeFace>*,std::vector<std::pair<int,tcu::CubeFace>,std::allocator<std::pair<int,tcu::CubeFace>>>>>
            (&rnd,(__normal_iterator<std::pair<int,_tcu::CubeFace>_*,_std::vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>_>
                   )images.
                    super__Vector_base<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::pair<int,_tcu::CubeFace>_*,_std::vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>_>
              )images.
               super__Vector_base<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  if (0 < (int)((ulong)((long)images.
                              super__Vector_base<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)images.
                             super__Vector_base<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
    lVar8 = 0;
    do {
      local_e4 = images.
                 super__Vector_base<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar8].first;
      CVar3 = images.
              super__Vector_base<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar8].second;
      iVar6 = (this->super_TextureCubeSpecCase).m_size >> ((byte)local_e4 & 0x1f);
      if (iVar6 < 2) {
        iVar6 = 1;
      }
      gMin.m_data[0] = 0.0;
      gMin.m_data[1] = 0.0;
      gMin.m_data[2] = 0.0;
      gMin.m_data[3] = 0.0;
      lVar10 = 0;
      do {
        fVar1 = (this->super_TextureCubeSpecCase).m_texFormatInfo.valueMin.m_data[lVar10];
        fVar2 = (this->super_TextureCubeSpecCase).m_texFormatInfo.valueMax.m_data[lVar10];
        fVar11 = deRandom_getFloat(&rnd.m_rnd);
        gMin.m_data[lVar10] = (fVar2 - fVar1) * fVar11 + fVar1;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 4);
      gMax.m_data[0] = 0.0;
      gMax.m_data[1] = 0.0;
      gMax.m_data[2] = 0.0;
      gMax.m_data[3] = 0.0;
      lVar10 = 0;
      do {
        fVar1 = (this->super_TextureCubeSpecCase).m_texFormatInfo.valueMin.m_data[lVar10];
        fVar2 = (this->super_TextureCubeSpecCase).m_texFormatInfo.valueMax.m_data[lVar10];
        fVar11 = deRandom_getFloat(&rnd.m_rnd);
        gMax.m_data[lVar10] = (fVar2 - fVar1) * fVar11 + fVar1;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 4);
      tcu::TextureLevel::setSize(&levelData,iVar6,iVar6,1);
      tcu::TextureLevel::getAccess(&local_58,&levelData);
      tcu::fillWithComponentGradients(&local_58,&gMin,&gMax);
      dVar4 = (&s_cubeMapFaces)[CVar3];
      internalFormat = this->m_internalFormat;
      format = this->m_format;
      type = this->m_dataType;
      tcu::TextureLevel::getAccess(&local_58,&levelData);
      sglr::ContextWrapper::glTexImage2D
                (this_00,dVar4,local_e4,internalFormat,iVar6,iVar6,0,format,type,
                 local_58.super_ConstPixelBufferAccess.m_data);
      lVar8 = lVar8 + 1;
    } while (lVar8 < (int)((ulong)((long)images.
                                         super__Vector_base<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)images.
                                        super__Vector_base<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  if (images.
      super__Vector_base<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(images.
                    super__Vector_base<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)images.
                          super__Vector_base<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)images.
                          super__Vector_base<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  tcu::TextureLevel::~TextureLevel(&levelData);
  return;
}

Assistant:

void createTexture (void)
	{
		deUint32			tex			= 0;
		tcu::TextureLevel	levelData	(glu::mapGLTransferFormat(m_format, m_dataType));
		de::Random			rnd			(deStringHash(getName()));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		// Level-face pairs.
		vector<pair<int, tcu::CubeFace> >	images	(m_numLevels*6);

		for (int ndx = 0; ndx < m_numLevels; ndx++)
			for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
				images[ndx*6 + face] = std::make_pair(ndx, (tcu::CubeFace)face);

		rnd.shuffle(images.begin(), images.end());

		for (int ndx = 0; ndx < (int)images.size(); ndx++)
		{
			int				levelNdx	= images[ndx].first;
			tcu::CubeFace	face		= images[ndx].second;
			int				levelSize	= de::max(1, m_size >> levelNdx);
			Vec4			gMin		= randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);
			Vec4			gMax		= randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);

			levelData.setSize(levelSize, levelSize);
			tcu::fillWithComponentGradients(levelData.getAccess(), gMin, gMax);

			glTexImage2D(s_cubeMapFaces[face], levelNdx, m_internalFormat, levelSize, levelSize, 0, m_format, m_dataType, levelData.getAccess().getDataPtr());
		}
	}